

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O2

WifiDebugOstream * operator<<(WifiDebugOstream *sink,uint i)

{
  size_t in_RCX;
  char c;
  
  if (9 < i) {
    operator<<(sink,i / 10);
  }
  c = (byte)(i % 10) | 0x30;
  WifiDebugOstream::write(sink,(int)&c,(void *)0x1,in_RCX);
  return sink;
}

Assistant:

T& operator<<( T& sink, unsigned int i )
{
  // Handle digits that aren't the lowest digit (if any)
  if ( i >= 10 )
  {
    sink << i/10;
  }

  // Handle the lowest digit
  char c = '0' + (i % 10);
  sink.write( &c, 1 );

  return sink;
}